

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

Polynomial *
parsePolynomial(Polynomial *__return_storage_ptr__,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,int numstates,string *str)

{
  string local_b0;
  undefined1 local_90 [8];
  PolynomialParser P;
  string *str_local;
  int numstates_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *varnames_local;
  
  P.mVarNames = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)str;
  translateOperatorNames(&local_b0,str,numstates);
  PolynomialParser::PolynomialParser((PolynomialParser *)local_90,varnames,numstates,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  PolynomialParser::value(__return_storage_ptr__,(PolynomialParser *)local_90);
  PolynomialParser::~PolynomialParser((PolynomialParser *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Polynomial parsePolynomial(const std::vector<std::string>& varnames, int numstates, const std::string& str)
{
  PolynomialParser P(varnames, numstates, translateOperatorNames(str, numstates));
  return P.value();
}